

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O3

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CNegativeExpression *expression)

{
  IExpression *pIVar1;
  ISubtreeWrapper *pIVar2;
  ISubtreeWrapper *pIVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: CNegativeExpression\n",0x21);
  pIVar1 = (expression->expression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  pIVar3 = (ISubtreeWrapper *)operator_new(0x10);
  pIVar2 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  pIVar3->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_00181628;
  pIVar3[1]._vptr_ISubtreeWrapper = (_func_int **)pIVar2;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar3;
  return;
}

Assistant:

void CBuildVisitor::Visit( CNegativeExpression &expression ) {
    std::cout << "IRT builder: CNegativeExpression\n";
    expression.expression->Accept( *this );

    updateSubtreeWrapper( new IRT::CNegateConditionalWrapper(
            std::move( wrapper )
    ));
}